

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hypatia.h
# Opt level: O3

matrix3 * matrix3_rotate(matrix3 *self,double angle)

{
  double dVar1;
  matrix3 rotationMatrix;
  anon_union_72_5_d0a4420b_for_matrix3_0 local_50;
  
  dVar1 = cos(angle);
  local_50.m[1] = sin(angle);
  local_50.m[2] = 0.0;
  local_50.m[4] = 1.0;
  local_50.m[6] = 0.0;
  local_50.m[7] = 0.0;
  local_50.m[8] = 1.0;
  local_50.m[3] = -local_50.m[1];
  local_50.m[0] = dVar1;
  local_50.m[5] = dVar1;
  matrix3_multiply(self,(matrix3 *)&local_50.field_1);
  return self;
}

Assistant:

HYPAPI struct matrix3 *matrix3_rotate(struct matrix3 *self, HYP_FLOAT angle)
{
	struct matrix3 rotationMatrix;

	return matrix3_multiply(self,
		matrix3_make_transformation_rotationf_z(&rotationMatrix, angle));
}